

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRep * absl::lts_20250127::cord_internal::CordRepBtree::ExtractFront(CordRepBtree *tree)

{
  CordRep *rep;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar1;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> edges;
  
  rep = Edge(tree,(ulong)(tree->super_CordRep).storage[1]);
  if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
    SVar1 = Edges(tree,(ulong)(tree->super_CordRep).storage[1] + 1,
                  (ulong)(tree->super_CordRep).storage[2]);
    edges.len_ = (pointer)SVar1.len_;
    edges.ptr_ = edges.len_;
    Unref((CordRepBtree *)SVar1.ptr_,edges);
    Delete(tree);
  }
  else {
    CordRep::Ref(rep);
    CordRep::Unref(&tree->super_CordRep);
  }
  return rep;
}

Assistant:

CordRep* CordRepBtree::ExtractFront(CordRepBtree* tree) {
  CordRep* front = tree->Edge(tree->begin());
  if (tree->refcount.IsOne()) {
    Unref(tree->Edges(tree->begin() + 1, tree->end()));
    CordRepBtree::Delete(tree);
  } else {
    CordRep::Ref(front);
    CordRep::Unref(tree);
  }
  return front;
}